

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Platform.cpp
# Opt level: O1

uint8_t __thiscall
GmmLib::PlatformInfoGen11::ValidateMMC(PlatformInfoGen11 *this,GMM_TEXTURE_INFO *Surf)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  uint8_t uVar2;
  
  aVar1 = (Surf->Flags).Gpu;
  if ((((aVar1._0_4_ >> 0x10 & 1) == 0) ||
      (((*(ushort *)&(Surf->Flags).Info.field_0x4 & 0x1850) != 0 && (Surf->ArraySize < 0x41)))) &&
     ((((~(ulong)aVar1 & 0x2000010000) != 0 ||
       ((((this->super_PlatformInfoGen10).super_PlatformInfo.pGmmLibContext)->pPlatformInfo->Data).
        Platform.eProductFamily != IGFX_LAKEFIELD)) ||
      ((((Surf->Flags).Info.field_0x4 & 0x10) != 0 &&
       ((Surf->Format == GMM_FORMAT_NV12 || (uVar2 = GmmIsP0xx(Surf->Format), uVar2 != '\0'))))))))
  {
    return '\x01';
  }
  return '\0';
}

Assistant:

uint8_t GmmLib::PlatformInfoGen11::ValidateMMC(GMM_TEXTURE_INFO &Surf)
{

    if(Surf.Flags.Gpu.MMC && //For Media Memory Compression --
       ((!(GMM_IS_4KB_TILE(Surf.Flags) || GMM_IS_64KB_TILE(Surf.Flags))) ||
        Surf.ArraySize > GMM_MAX_MMC_INDEX))
    {
        return 0;
    }

    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_LAKEFIELD)
    {
        if(Surf.Flags.Gpu.MMC &&
           Surf.Flags.Gpu.UnifiedAuxSurface &&
           !(Surf.Flags.Info.TiledY &&
             (Surf.Format == GMM_FORMAT_NV12 || GmmIsP0xx(Surf.Format))))
        {
            GMM_ASSERTDPF(0, "Invalid MMC usage for LKF!");
            return 0;
        }
    }
    return 1;
}